

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drive-test.cpp
# Opt level: O0

void __thiscall control::drive(control *this,int speed,int time)

{
  size_type sVar1;
  int in_EDX;
  duration<long,_std::ratio<1L,_1000L>_> *in_RDI;
  bool bVar2;
  key_type *in_stack_fffffffffffffee8;
  allocator *in_stack_fffffffffffffef0;
  int in_stack_ffffffffffffff1c;
  motor *in_stack_ffffffffffffff20;
  undefined5 in_stack_ffffffffffffff28;
  byte in_stack_ffffffffffffff2d;
  byte in_stack_ffffffffffffff2e;
  allocator in_stack_ffffffffffffff2f;
  string local_d0 [39];
  byte local_a9;
  allocator local_61;
  string local_60 [80];
  int local_10;
  
  local_10 = in_EDX;
  ev3dev::motor::set_speed_sp(in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c);
  ev3dev::motor::set_speed_sp(in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c);
  *(undefined4 *)&in_RDI[0x1a].__r = 1;
  if (local_10 < 1) {
    ev3dev::motor::run_forever(in_stack_ffffffffffffff20);
    ev3dev::motor::run_forever(in_stack_ffffffffffffff20);
  }
  else {
    ev3dev::motor::set_time_sp(in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c);
    ev3dev::motor::run_timed(in_stack_ffffffffffffff20);
    ev3dev::motor::set_time_sp(in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c);
    ev3dev::motor::run_timed(in_stack_ffffffffffffff20);
    while( true ) {
      ev3dev::motor::state_abi_cxx11_
                ((motor *)CONCAT17(in_stack_ffffffffffffff2f,
                                   CONCAT16(in_stack_ffffffffffffff2e,
                                            CONCAT15(in_stack_ffffffffffffff2d,
                                                     in_stack_ffffffffffffff28))));
      std::allocator<char>::allocator();
      local_a9 = 0;
      in_stack_ffffffffffffff2e = 0;
      in_stack_ffffffffffffff2d = 0;
      std::__cxx11::string::string(local_60,"running",&local_61);
      sVar1 = std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::count((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
      bVar2 = true;
      if (sVar1 == 0) {
        ev3dev::motor::state_abi_cxx11_
                  ((motor *)CONCAT17(in_stack_ffffffffffffff2f,
                                     CONCAT16(in_stack_ffffffffffffff2e,
                                              CONCAT15(in_stack_ffffffffffffff2d,
                                                       in_stack_ffffffffffffff28))));
        local_a9 = 1;
        in_stack_fffffffffffffef0 = (allocator *)&stack0xffffffffffffff2f;
        std::allocator<char>::allocator();
        in_stack_ffffffffffffff2e = 1;
        std::__cxx11::string::string(local_d0,"running",in_stack_fffffffffffffef0);
        in_stack_ffffffffffffff2d = 1;
        in_stack_fffffffffffffee8 =
             (key_type *)
             std::
             set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::count((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
        bVar2 = in_stack_fffffffffffffee8 != (key_type *)0x0;
      }
      if ((in_stack_ffffffffffffff2d & 1) != 0) {
        std::__cxx11::string::~string(local_d0);
      }
      if ((in_stack_ffffffffffffff2e & 1) != 0) {
        std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff2f);
      }
      if ((local_a9 & 1) != 0) {
        std::
        set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)0x1238e8);
      }
      std::__cxx11::string::~string(local_60);
      std::allocator<char>::~allocator((allocator<char> *)&local_61);
      std::
      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0x12390f);
      if (!bVar2) break;
      std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
                ((duration<long,std::ratio<1l,1000l>> *)&stack0xffffffffffffff20,
                 (int *)&stack0xffffffffffffff1c);
      std::this_thread::sleep_for<long,std::ratio<1l,1000l>>(in_RDI);
    }
    *(undefined4 *)&in_RDI[0x1a].__r = 0;
  }
  return;
}

Assistant:

void control::drive(int speed, int time)
{
  _motor_left.set_speed_sp(-speed);

  _motor_right.set_speed_sp(-speed);

  _state = state_driving;

  if (time > 0)
  {
    _motor_left .set_time_sp(time).run_timed();
    _motor_right.set_time_sp(time).run_timed();

    while (_motor_left.state().count("running") || _motor_right.state().count("running"))
      this_thread::sleep_for(chrono::milliseconds(10));

    _state = state_idle;
  }
  else
  {
    _motor_left.run_forever();
    _motor_right.run_forever();
  }
}